

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeUnbind(Vdbe *p,uint i)

{
  long lVar1;
  int iVar2;
  uint in_ESI;
  long *in_RDI;
  Mem *pVar;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffd4;
  int local_4;
  
  iVar2 = vdbeSafetyNotNull((Vdbe *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  if (iVar2 == 0) {
    sqlite3_mutex_enter((sqlite3_mutex *)0x140fbf);
    if (*(char *)((long)in_RDI + 199) == '\x01') {
      if (in_ESI < (uint)(int)(short)in_RDI[4]) {
        lVar1 = in_RDI[0x10];
        sqlite3VdbeMemRelease((Mem *)0x14109d);
        *(undefined2 *)(lVar1 + (ulong)in_ESI * 0x38 + 0x14) = 1;
        *(undefined4 *)(*in_RDI + 0x50) = 0;
        if (*(int *)((long)in_RDI + 0x11c) != 0) {
          if (in_ESI < 0x1f) {
            uVar3 = 1 << ((byte)in_ESI & 0x1f);
          }
          else {
            uVar3 = 0x80000000;
          }
          if ((*(uint *)((long)in_RDI + 0x11c) & uVar3) != 0) {
            *(ushort *)(in_RDI + 0x19) = *(ushort *)(in_RDI + 0x19) & 0xfffc | 1;
          }
        }
        local_4 = 0;
      }
      else {
        sqlite3Error((sqlite3 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc);
        sqlite3_mutex_leave((sqlite3_mutex *)0x14106a);
        local_4 = 0x19;
      }
    }
    else {
      sqlite3MisuseError(0);
      sqlite3Error((sqlite3 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc);
      sqlite3_mutex_leave((sqlite3_mutex *)0x141004);
      sqlite3_log(0x15,"bind on a busy prepared statement: [%s]",in_RDI[0x1f]);
      local_4 = sqlite3MisuseError(0);
    }
  }
  else {
    local_4 = sqlite3MisuseError(0);
  }
  return local_4;
}

Assistant:

static int vdbeUnbind(Vdbe *p, unsigned int i){
  Mem *pVar;
  if( vdbeSafetyNotNull(p) ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(p->db->mutex);
  if( p->eVdbeState!=VDBE_READY_STATE ){
    sqlite3Error(p->db, SQLITE_MISUSE_BKPT);
    sqlite3_mutex_leave(p->db->mutex);
    sqlite3_log(SQLITE_MISUSE,
        "bind on a busy prepared statement: [%s]", p->zSql);
    return SQLITE_MISUSE_BKPT;
  }
  if( i>=(unsigned int)p->nVar ){
    sqlite3Error(p->db, SQLITE_RANGE);
    sqlite3_mutex_leave(p->db->mutex);
    return SQLITE_RANGE;
  }
  pVar = &p->aVar[i];
  sqlite3VdbeMemRelease(pVar);
  pVar->flags = MEM_Null;
  p->db->errCode = SQLITE_OK;

  /* If the bit corresponding to this variable in Vdbe.expmask is set, then
  ** binding a new value to this variable invalidates the current query plan.
  **
  ** IMPLEMENTATION-OF: R-57496-20354 If the specific value bound to a host
  ** parameter in the WHERE clause might influence the choice of query plan
  ** for a statement, then the statement will be automatically recompiled,
  ** as if there had been a schema change, on the first sqlite3_step() call
  ** following any change to the bindings of that parameter.
  */
  assert( (p->prepFlags & SQLITE_PREPARE_SAVESQL)!=0 || p->expmask==0 );
  if( p->expmask!=0 && (p->expmask & (i>=31 ? 0x80000000 : (u32)1<<i))!=0 ){
    p->expired = 1;
  }
  return SQLITE_OK;
}